

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3NotPureFunc(sqlite3_context *pCtx)

{
  ushort uVar1;
  Op *pOVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  pOVar2 = pCtx->pVdbe->aOp;
  iVar4 = 1;
  if (pOVar2[pCtx->iOp].opcode == 'A') {
    uVar1 = pOVar2[pCtx->iOp].p5;
    pcVar5 = "a generated column";
    if ((uVar1 & 8) == 0) {
      pcVar5 = "an index";
    }
    pcVar3 = "a CHECK constraint";
    if ((uVar1 & 4) == 0) {
      pcVar3 = pcVar5;
    }
    iVar4 = 0;
    pcVar5 = sqlite3_mprintf("non-deterministic use of %s() in %s",pCtx->pFunc->zName,pcVar3);
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr(pCtx->pOut,pcVar5,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3_free(pcVar5);
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3NotPureFunc(sqlite3_context *pCtx){
  const VdbeOp *pOp;
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx->pVdbe==0 ) return 1;
#endif
  pOp = pCtx->pVdbe->aOp + pCtx->iOp;
  if( pOp->opcode==OP_PureFunc ){
    const char *zContext;
    char *zMsg;
    if( pOp->p5 & NC_IsCheck ){
      zContext = "a CHECK constraint";
    }else if( pOp->p5 & NC_GenCol ){
      zContext = "a generated column";
    }else{
      zContext = "an index";
    }
    zMsg = sqlite3_mprintf("non-deterministic use of %s() in %s",
                           pCtx->pFunc->zName, zContext);
    sqlite3_result_error(pCtx, zMsg, -1);
    sqlite3_free(zMsg);
    return 0;
  }
  return 1;
}